

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::getTimingTagsMemcpy
          (CLIntercept *this,char *functionName,cl_command_queue queue,cl_bool blocking,void *dst,
          void *src,size_t size,string *hostTag,string *deviceTag)

{
  cl_platform_id platform;
  CLdispatchX *pCVar1;
  cl_context context;
  cl_bool local_14c;
  cl_unified_shared_memory_type_intel srcType;
  cl_unified_shared_memory_type_intel dstType;
  char *local_140;
  char s [256];
  
  local_14c = blocking;
  local_140 = functionName;
  std::mutex::lock(&this->m_Mutex);
  platform = getPlatform(this,queue);
  pCVar1 = dispatchX(this,platform);
  if (pCVar1->clGetMemAllocInfoINTEL ==
      (_func_cl_int_cl_context_void_ptr_cl_mem_info_intel_size_t_void_ptr_size_t_ptr *)0x0) {
    std::__cxx11::string::string((string *)s,"clGetMemAllocInfoINTEL",(allocator *)&context);
    getExtensionFunctionAddress(this,platform,(string *)s);
    std::__cxx11::string::~string((string *)s);
  }
  pCVar1 = dispatchX(this,platform);
  if (pCVar1->clGetMemAllocInfoINTEL !=
      (_func_cl_int_cl_context_void_ptr_cl_mem_info_intel_size_t_void_ptr_size_t_ptr *)0x0) {
    context = (cl_context)0x0;
    (*(this->m_Dispatch).clGetCommandQueueInfo)(queue,0x1090,8,&context,(size_t *)0x0);
    if (context != (cl_context)0x0) {
      dstType = 0x4196;
      (*pCVar1->clGetMemAllocInfoINTEL)(context,dst,0x419a,4,&dstType,(size_t *)0x0);
      srcType = 0x4196;
      (*pCVar1->clGetMemAllocInfoINTEL)(context,src,0x419a,4,&srcType,(size_t *)0x0);
      std::__cxx11::string::append((char *)hostTag);
      std::__cxx11::string::append((char *)hostTag);
      std::__cxx11::string::reserve((ulong)deviceTag);
      std::__cxx11::string::assign((char *)deviceTag);
      std::__cxx11::string::append((char *)deviceTag);
      std::__cxx11::string::append((string *)deviceTag);
      if ((size != 0) && ((this->m_Config).DevicePerformanceTimeTransferTracking == true)) {
        snprintf(s,0x100,"; %zu bytes");
        std::__cxx11::string::append((char *)deviceTag);
      }
      std::__cxx11::string::append((char *)deviceTag);
    }
  }
  if (local_14c == 1) {
    std::__cxx11::string::append((char *)hostTag);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void CLIntercept::getTimingTagsMemcpy(
    const char* functionName,
    const cl_command_queue queue,
    const cl_bool blocking,
    const void* dst,
    const void* src,
    const size_t size,
    std::string& hostTag,
    std::string& deviceTag )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_platform_id  platform = getPlatform(queue);

    // If we don't have a function pointer for clGetMemAllocINFO, try to
    // get one.  It's possible that the function pointer exists but
    // the application hasn't queried for it yet, in which case it won't
    // be installed into the dispatch table.
    if( dispatchX(platform).clGetMemAllocInfoINTEL == NULL )
    {
        getExtensionFunctionAddress(
            platform,
            "clGetMemAllocInfoINTEL" );
    }

    const auto& dispatchX = this->dispatchX(platform);
    if( dispatchX.clGetMemAllocInfoINTEL != NULL )
    {
        cl_context  context = NULL;
        dispatch().clGetCommandQueueInfo(
            queue,
            CL_QUEUE_CONTEXT,
            sizeof( context ),
            &context,
            NULL );

        if( context )
        {
            cl_unified_shared_memory_type_intel dstType = CL_MEM_TYPE_UNKNOWN_INTEL;
            dispatchX.clGetMemAllocInfoINTEL(
                context,
                dst,
                CL_MEM_ALLOC_TYPE_INTEL,
                sizeof(dstType),
                &dstType,
                NULL );
            cl_unified_shared_memory_type_intel srcType = CL_MEM_TYPE_UNKNOWN_INTEL;
            dispatchX.clGetMemAllocInfoINTEL(
                context,
                src,
                CL_MEM_ALLOC_TYPE_INTEL,
                sizeof(srcType),
                &srcType,
                NULL );
            switch( srcType )
            {
            case CL_MEM_TYPE_DEVICE_INTEL:  hostTag += "Dto"; break;
            case CL_MEM_TYPE_HOST_INTEL:    hostTag += "Hto"; break;
            case CL_MEM_TYPE_SHARED_INTEL:  hostTag += "Sto"; break;
            default:                        hostTag += "Mto"; break;
            }
            switch( dstType )
            {
            case CL_MEM_TYPE_DEVICE_INTEL:  hostTag += "D"; break;
            case CL_MEM_TYPE_HOST_INTEL:    hostTag += "H"; break;
            case CL_MEM_TYPE_SHARED_INTEL:  hostTag += "S"; break;
            default:                        hostTag += "M"; break;
            }

            deviceTag.reserve(128);
            deviceTag = functionName;
            deviceTag += "( ";
            deviceTag += hostTag;
            if( size && config().DevicePerformanceTimeTransferTracking )
            {
                char    s[256];
                CLI_SPRINTF( s, 256, "; %zu bytes", size );
                deviceTag += s;
            }
            deviceTag += " )";
        }
    }

    if( blocking == CL_TRUE )
    {
        hostTag += "; blocking";
    }
}